

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cpp
# Opt level: O3

bool PartStream_BlockRead
               (TBlockStream *pStream,ULONGLONG StartOffset,ULONGLONG EndOffset,LPBYTE BlockBuffer,
               DWORD BytesNeeded,bool bAvailable)

{
  TFileStream *pTVar1;
  bool bVar2;
  undefined4 *puVar3;
  DWORD DVar4;
  void *pvVar5;
  ulong uVar6;
  ULONGLONG ByteOffset;
  ULONGLONG local_40;
  ULONGLONG local_38;
  
  uVar6 = (ulong)pStream->BlockSize;
  local_38 = StartOffset;
  if (pStream->FileBitmap == (void *)0x0) {
    __assert_fail("pStream->FileBitmap != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/FileStream.cpp"
                  ,0x644,
                  "bool PartStream_BlockRead(TBlockStream *, ULONGLONG, ULONGLONG, LPBYTE, DWORD, bool)"
                 );
  }
  if ((pStream->BlockSize - 1 & (uint)StartOffset) != 0) {
    __assert_fail("(StartOffset & (pStream->BlockSize - 1)) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/FileStream.cpp"
                  ,0x645,
                  "bool PartStream_BlockRead(TBlockStream *, ULONGLONG, ULONGLONG, LPBYTE, DWORD, bool)"
                 );
  }
  if (EndOffset <= StartOffset) {
    __assert_fail("StartOffset < EndOffset",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/FileStream.cpp"
                  ,0x646,
                  "bool PartStream_BlockRead(TBlockStream *, ULONGLONG, ULONGLONG, LPBYTE, DWORD, bool)"
                 );
  }
  if (bAvailable) {
    pvVar5 = (void *)((long)pStream->FileBitmap + (StartOffset / uVar6 & 0xffffffff) * 0x14);
    do {
      DVar4 = (int)EndOffset - (int)StartOffset;
      if ((uint)uVar6 < DVar4) {
        DVar4 = (uint)uVar6;
      }
      if (BytesNeeded <= DVar4) {
        DVar4 = BytesNeeded;
      }
      local_40 = *(ULONGLONG *)((long)pvVar5 + 4);
      bVar2 = (*(pStream->super_TFileStream).BaseRead)
                        (&pStream->super_TFileStream,&local_40,BlockBuffer,DVar4);
      if (!bVar2) {
        return bVar2;
      }
      uVar6 = (ulong)pStream->BlockSize;
      StartOffset = StartOffset + uVar6;
      BlockBuffer = BlockBuffer + uVar6;
      BytesNeeded = BytesNeeded - pStream->BlockSize;
      pvVar5 = (void *)((long)pvVar5 + 0x14);
    } while (StartOffset < EndOffset);
  }
  else {
    pTVar1 = (pStream->super_TFileStream).pMaster;
    if (pTVar1 != (TFileStream *)0x0) {
      if (pTVar1->StreamRead == (STREAM_READ)0x0) {
        __assert_fail("pStream->StreamRead != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/FileStream.cpp"
                      ,0xa1c,"bool FileStream_Read(TFileStream *, ULONGLONG *, void *, DWORD)");
      }
      DVar4 = (int)EndOffset - (uint)StartOffset;
      bVar2 = (*pTVar1->StreamRead)(pTVar1,&local_38,BlockBuffer,DVar4);
      if (bVar2) {
        bVar2 = (*(pStream->super_TFileStream).BaseGetSize)(&pStream->super_TFileStream,&local_40);
        if (!bVar2) {
          return true;
        }
        bVar2 = (*(pStream->super_TFileStream).BaseWrite)
                          (&pStream->super_TFileStream,&local_40,BlockBuffer,DVar4);
        if (bVar2) {
          uVar6 = (ulong)pStream->BlockSize;
          if (((uint)local_38 & pStream->BlockSize - 1) != 0) {
            __assert_fail("(StartOffset & (BlockSize - 1)) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/FileStream.cpp"
                          ,0x60d,
                          "void PartStream_UpdateBitmap(TBlockStream *, ULONGLONG, ULONGLONG, ULONGLONG)"
                         );
          }
          if (pStream->FileBitmap == (void *)0x0) {
            __assert_fail("pStream->FileBitmap != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/FileStream.cpp"
                          ,0x60e,
                          "void PartStream_UpdateBitmap(TBlockStream *, ULONGLONG, ULONGLONG, ULONGLONG)"
                         );
          }
          if (local_38 < EndOffset) {
            puVar3 = (undefined4 *)((long)pStream->FileBitmap + (local_38 / uVar6) * 0x14);
            do {
              *(ULONGLONG *)(puVar3 + 1) = local_40;
              *puVar3 = 3;
              local_38 = local_38 + uVar6;
              local_40 = local_40 + uVar6;
              puVar3 = puVar3 + 5;
            } while (local_38 < EndOffset);
          }
          pStream->IsModified = 1;
        }
        return true;
      }
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

static bool PartStream_BlockRead(
    TBlockStream * pStream,
    ULONGLONG StartOffset,
    ULONGLONG EndOffset,
    LPBYTE BlockBuffer,
    DWORD BytesNeeded,
    bool bAvailable)
{
    PPART_FILE_MAP_ENTRY FileBitmap;
    ULONGLONG ByteOffset;
    DWORD BytesToRead;
    DWORD BlockIndex = (DWORD)(StartOffset / pStream->BlockSize);

    // The starting offset must be aligned to size of the block
    assert(pStream->FileBitmap != NULL);
    assert((StartOffset & (pStream->BlockSize - 1)) == 0);
    assert(StartOffset < EndOffset);

    // If the blocks are not available, we need to load them from the master
    // and then save to the mirror
    if(bAvailable == false)
    {
        // If we have no master, we cannot satisfy read request
        if(pStream->pMaster == NULL)
            return false;

        // Load the blocks from the master stream
        // Note that we always have to read complete blocks
        // so they get properly stored to the mirror stream
        BytesToRead = (DWORD)(EndOffset - StartOffset);
        if(!FileStream_Read(pStream->pMaster, &StartOffset, BlockBuffer, BytesToRead))
            return false;

        // The loaded blocks are going to be stored to the end of the file
        // Note that this operation is not required to succeed
        if(pStream->BaseGetSize(pStream, &ByteOffset))
        {
            // Store the loaded blocks to the mirror file.
            if(pStream->BaseWrite(pStream, &ByteOffset, BlockBuffer, BytesToRead))
            {
                PartStream_UpdateBitmap(pStream, StartOffset, EndOffset, ByteOffset);
            }
        }
    }
    else
    {
        // Get the file map entry
        FileBitmap = (PPART_FILE_MAP_ENTRY)pStream->FileBitmap + BlockIndex;

        // Read all blocks
        while(StartOffset < EndOffset)
        {
            // Get the number of bytes to be read
            BytesToRead = (DWORD)(EndOffset - StartOffset);
            if(BytesToRead > pStream->BlockSize)
                BytesToRead = pStream->BlockSize;
            if(BytesToRead > BytesNeeded)
                BytesToRead = BytesNeeded;

            // Read the block
            ByteOffset = MAKE_OFFSET64(FileBitmap->BlockOffsHi, FileBitmap->BlockOffsLo);
            if(!pStream->BaseRead(pStream, &ByteOffset, BlockBuffer, BytesToRead))
                return false;

            // Move the pointers
            StartOffset += pStream->BlockSize;
            BlockBuffer += pStream->BlockSize;
            BytesNeeded -= pStream->BlockSize;
            FileBitmap++;
        }
    }

    return true;
}